

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store_array_text<embree::Vec2<float>>
          (XMLWriter *this,char *name,
          vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *vec)

{
  int __oflag;
  long lVar1;
  size_t i;
  ulong uVar2;
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string(local_48,name,&local_69);
  open(this,(char *)local_48,__oflag);
  std::__cxx11::string::~string(local_48);
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(vec->
                            super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vec->
                            super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    tab(this);
    store_array_elt(this,(Vec2f *)((long)&((vec->
                                           super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->field_0 +
                                  lVar1));
    lVar1 = lVar1 + 8;
  }
  std::__cxx11::string::string(local_68,name,&local_69);
  close(this,(int)local_68);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const std::vector<T>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }